

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Naming.hpp
# Opt level: O3

string * ArrVarName(string *__return_storage_ptr__,Doublet *dbra,string *ketstr,string *prefix)

{
  size_type sVar1;
  pointer pcVar2;
  string tag;
  string local_50;
  
  sVar1 = (dbra->tag)._M_string_length;
  if (sVar1 == 0) {
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&tag,"");
  }
  else {
    tag._M_dataplus._M_p = (pointer)&tag.field_2;
    pcVar2 = (dbra->tag)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>((string *)&tag,pcVar2,pcVar2 + sVar1);
    std::__cxx11::string::append((char *)&tag);
  }
  StringBuilder<char[6],std::__cxx11::string&,char_const&,char_const(&)[2],char_const&,char_const(&)[2],std::__cxx11::string_const&>
            (&local_50,(char (*) [6])"INT__",&tag,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" +
             (long)(dbra->left).ijk._M_elems[1] + (long)(dbra->left).ijk._M_elems[0] +
             (long)(dbra->left).ijk._M_elems[2],(char (*) [2])0x149cdc,
             "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789" +
             (long)(dbra->right).ijk._M_elems[1] + (long)(dbra->right).ijk._M_elems[0] +
             (long)(dbra->right).ijk._M_elems[2],(char (*) [2])0x149cdc,ketstr);
  if (prefix->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           local_50.field_2._M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = local_50._M_string_length;
  }
  else {
    StringBuilder<std::__cxx11::string,char_const(&)[2],std::__cxx11::string&>
              (__return_storage_ptr__,prefix,(char (*) [2])0x149cdc,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)tag._M_dataplus._M_p != &tag.field_2) {
    operator_delete(tag._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArrVarName(Doublet dbra, const std::string & ketstr, const std::string & prefix = "")
{
    std::string tag = (dbra.tag.size() ? dbra.tag + "_" : "");
    std::string str = StringBuilder("INT__" , tag, amchar[dbra.left.am()],
                                    "_", amchar[dbra.right.am()], "_", ketstr);
    
    if(prefix.size())
        return StringBuilder(prefix, "_", str);
    else
        return str;
}